

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O1

Long __thiscall amrex::Amr::cellCount(Amr *this)

{
  Long LVar1;
  Long LVar2;
  long lVar3;
  
  if (*(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c < 0) {
    LVar2 = 0;
  }
  else {
    lVar3 = -1;
    LVar2 = 0;
    do {
      LVar1 = AmrLevel::countCells
                        ((AmrLevel *)
                         (this->amr_level).
                         super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                         .
                         super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar3 + 1]._M_t.
                         super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                        );
      LVar2 = LVar2 + LVar1;
      lVar3 = lVar3 + 1;
    } while (lVar3 < *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c);
  }
  return LVar2;
}

Assistant:

Long
Amr::cellCount () noexcept
{
    Long cnt = 0;
    for (int i = 0; i <= finest_level; i++) {
        cnt += amr_level[i]->countCells();
    }
    return cnt;
}